

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::set_limit_impl(torrent *this,int limit,int channel,bool state_update)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  peer_class *ppVar3;
  peer_class *tpc;
  int local_18;
  int iStack_14;
  bool state_update_local;
  int channel_local;
  int limit_local;
  torrent *this_local;
  
  if ((limit < 1) || (iStack_14 = limit, limit == 0x7fffffff)) {
    iStack_14 = 0;
  }
  tpc._7_1_ = state_update;
  local_18 = channel;
  _channel_local = this;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>::strong_typedef
            ((strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> *)&tpc,0);
  bVar1 = strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>::operator==
                    (&this->m_peer_class,
                     (strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> *)&tpc);
  if (bVar1) {
    if (iStack_14 == 0) {
      return;
    }
    setup_peer_class(this);
  }
  iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x32])();
  ppVar3 = peer_class_pool::at((peer_class_pool *)CONCAT44(extraout_var,iVar2),
                               (peer_class_t)(this->m_peer_class).m_val);
  iVar2 = bandwidth_channel::throttle
                    ((bandwidth_channel *)(&ppVar3->priority + (long)local_18 * 3 + -7));
  if (iVar2 != iStack_14) {
    if ((tpc._7_1_ & 1) != 0) {
      state_updated(this);
      set_need_save_resume(this,(resume_data_flags_t)0x20);
    }
    bandwidth_channel::throttle
              ((bandwidth_channel *)(&ppVar3->priority + (long)local_18 * 3 + -7),iStack_14);
  }
  return;
}

Assistant:

void torrent::set_limit_impl(int limit, int const channel, bool const state_update)
	{
		TORRENT_ASSERT(is_single_thread());
		if (limit <= 0 || limit == aux::bandwidth_channel::inf) limit = 0;

		if (m_peer_class == peer_class_t{0})
		{
			if (limit == 0) return;
			setup_peer_class();
		}

		struct peer_class* tpc = m_ses.peer_classes().at(m_peer_class);
		TORRENT_ASSERT(tpc);
		if (tpc->channel[channel].throttle() == limit) return;
		if (state_update)
		{
			state_updated();
			set_need_save_resume(torrent_handle::if_config_changed);
		}
		tpc->channel[channel].throttle(limit);
	}